

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxleastsqsc.hpp
# Opt level: O1

void soplex::updateScaleFinal<double>
               (SSVectorBase<double> *vecnnzeroes,SSVectorBase<double> *resnvec,
               SSVectorBase<double> *tmpvec,SSVectorBase<double> **psccurr,
               SSVectorBase<double> **pscprev,double q,double eprev1,double eprev2,double epsilon)

{
  int iVar1;
  int *piVar2;
  pointer pdVar3;
  long lVar4;
  SSVectorBase<double> *pSVar5;
  
  SSVectorBase<double>::operator-=(*pscprev,*psccurr);
  pSVar5 = *pscprev;
  if (ABS(-eprev1 * eprev2) <= epsilon) {
    SSVectorBase<double>::clear(pSVar5);
  }
  else {
    lVar4 = (long)(pSVar5->super_IdxSet).num;
    if (0 < lVar4) {
      piVar2 = (pSVar5->super_IdxSet).idx;
      pdVar3 = (pSVar5->super_VectorBase<double>).val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar4 = lVar4 + 1;
      do {
        iVar1 = piVar2[lVar4 + -2];
        pdVar3[iVar1] = pdVar3[iVar1] * -eprev1 * eprev2;
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
  }
  pSVar5 = SSVectorBase<double>::assignPWproduct4setup<double,double>(tmpvec,resnvec,vecnnzeroes);
  SSVectorBase<double>::operator+=(*pscprev,pSVar5);
  pSVar5 = *pscprev;
  lVar4 = (long)(pSVar5->super_IdxSet).num;
  if (0 < lVar4) {
    piVar2 = (pSVar5->super_IdxSet).idx;
    pdVar3 = (pSVar5->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    lVar4 = lVar4 + 1;
    do {
      iVar1 = piVar2[lVar4 + -2];
      pdVar3[iVar1] = pdVar3[iVar1] * (1.0 / q);
      lVar4 = lVar4 + -1;
    } while (1 < lVar4);
  }
  SSVectorBase<double>::operator+=(pSVar5,*psccurr);
  *psccurr = *pscprev;
  return;
}

Assistant:

static void updateScaleFinal(
   const SSVectorBase<R> vecnnzeroes,
   const SSVectorBase<R> resnvec,
   SSVectorBase<R>& tmpvec,
   SSVectorBase<R>*& psccurr,
   SSVectorBase<R>*& pscprev,
   R q,
   R eprev1,
   R eprev2,
   R epsilon)
{
   assert(q != 0);
   assert(psccurr != nullptr);
   assert(pscprev != nullptr);

   R fac = -(eprev1 * eprev2);

   *pscprev -= *psccurr;

   if(isZero(fac, epsilon))
      (*pscprev).clear();
   else
      *pscprev *= fac;

   *pscprev += tmpvec.assignPWproduct4setup(resnvec, vecnnzeroes);
   *pscprev *= 1.0 / q;
   *pscprev += *psccurr;

   psccurr = pscprev;
}